

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int get_one_and_zeros_padding(uchar *input,size_t input_len,size_t *data_len)

{
  byte bVar1;
  byte local_33;
  byte local_31;
  uchar bad;
  uchar prev_done;
  size_t sStack_30;
  uchar done;
  size_t i;
  size_t *data_len_local;
  size_t input_len_local;
  uchar *input_local;
  
  local_31 = 0;
  if ((input == (uchar *)0x0) || (data_len == (size_t *)0x0)) {
    input_local._4_4_ = -0x6100;
  }
  else {
    local_33 = 0x80;
    *data_len = 0;
    for (sStack_30 = input_len; sStack_30 != 0; sStack_30 = sStack_30 - 1) {
      bVar1 = local_31 | input[sStack_30 - 1] != '\0';
      *data_len = (sStack_30 - 1) * (long)(int)(uint)(bVar1 != local_31) | *data_len;
      local_33 = local_33 ^ input[sStack_30 - 1] * (bVar1 != local_31);
      local_31 = bVar1;
    }
    input_local._4_4_ = (uint)(local_33 != 0) * -0x6200;
  }
  return input_local._4_4_;
}

Assistant:

static int get_one_and_zeros_padding( unsigned char *input, size_t input_len,
                                      size_t *data_len )
{
    size_t i;
    unsigned char done = 0, prev_done, bad;

    if( NULL == input || NULL == data_len )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    bad = 0x80;
    *data_len = 0;
    for( i = input_len; i > 0; i-- )
    {
        prev_done = done;
        done |= ( input[i - 1] != 0 );
        *data_len |= ( i - 1 ) * ( done != prev_done );
        bad ^= input[i - 1] * ( done != prev_done );
    }

    return( MBEDTLS_ERR_CIPHER_INVALID_PADDING * ( bad != 0 ) );

}